

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

void __thiscall
rtb::Filter::Polynomial<double>::Polynomial
          (Polynomial<double> *this,vector<double,_std::allocator<double>_> *coefficients)

{
  bool bVar1;
  reference pdVar2;
  complex<double> local_48;
  double local_38;
  double c;
  const_iterator __end0;
  const_iterator __begin0;
  vector<double,_std::allocator<double>_> *__range2;
  vector<double,_std::allocator<double>_> *coefficients_local;
  Polynomial<double> *this_local;
  
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&this->coefficients_);
  __end0 = std::vector<double,_std::allocator<double>_>::begin(coefficients);
  c = (double)std::vector<double,_std::allocator<double>_>::end(coefficients);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&c);
    if (!bVar1) break;
    pdVar2 = __gnu_cxx::
             __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end0);
    local_38 = *pdVar2;
    std::complex<double>::complex(&local_48,local_38,0.0);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::push_back
              (&this->coefficients_,&local_48);
    __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end0);
  }
  removeHighOrderZeroCoefficients(this);
  updateOrderAndSize(this);
  return;
}

Assistant:

Polynomial<T>::Polynomial(const std::vector<T>& coefficients)
        {
            for (auto c : coefficients)
                coefficients_.push_back(c);

            removeHighOrderZeroCoefficients();
            updateOrderAndSize();
        }